

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_constraint_handler_s.c
# Opt level: O2

constraint_handler_t set_constraint_handler_s(constraint_handler_t handler)

{
  constraint_handler_t p_Var1;
  
  p_Var1 = _PDCLIB_constraint_handler;
  if (handler == (constraint_handler_t)0x0) {
    handler = abort_handler_s;
  }
  _PDCLIB_constraint_handler = handler;
  return p_Var1;
}

Assistant:

constraint_handler_t set_constraint_handler_s( constraint_handler_t handler )
{
    constraint_handler_t previous = _PDCLIB_constraint_handler;

    if ( handler == NULL )
    {
        _PDCLIB_constraint_handler = abort_handler_s;
    }
    else
    {
        _PDCLIB_constraint_handler = handler;
    }

    return previous;
}